

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_copy_to_file.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalCopyToFile::Deserialize(LogicalCopyToFile *this,Deserializer *deserializer)

{
  _Head_base<0UL,_duckdb::FunctionData_*,_false> _Var1;
  CopyInfo *pCVar2;
  undefined8 uVar3;
  bool bVar4;
  CopyOverwriteMode CVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  CopyFunctionReturnType CVar10;
  bool write_part_cols;
  bool bVar11;
  PreserveOrderType PVar12;
  ClientContext *context;
  CopyFunctionCatalogEntry *pCVar13;
  pointer pLVar14;
  InternalException *pIVar15;
  _Head_base<0UL,_duckdb::FunctionData_*,_false> local_4c0;
  CopyFunctionBindInput function_bind_input;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_490;
  undefined1 local_488 [24];
  string default_extension;
  vector<unsigned_long,_true> partition_columns;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names_to_write;
  vector<duckdb::LogicalType,_true> expected_types;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  names;
  vector<duckdb::LogicalType,_true> types_to_write;
  undefined1 local_3d0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  FilenamePattern filename_pattern;
  CopyFunction function;
  
  Deserializer::ReadProperty<std::__cxx11::string>(&file_path,deserializer,200,"file_path");
  bVar4 = Deserializer::ReadProperty<bool>(deserializer,0xc9,"use_tmp_file");
  Deserializer::ReadProperty<duckdb::FilenamePattern>
            (&filename_pattern,deserializer,0xca,"filename_pattern");
  CVar5 = Deserializer::ReadProperty<duckdb::CopyOverwriteMode>(deserializer,0xcb,"overwrite_mode");
  bVar6 = Deserializer::ReadProperty<bool>(deserializer,0xcc,"per_thread_output");
  bVar7 = Deserializer::ReadProperty<bool>(deserializer,0xcd,"partition_output");
  Deserializer::ReadProperty<duckdb::vector<unsigned_long,true>>
            (&partition_columns,deserializer,0xce,"partition_columns");
  Deserializer::ReadProperty<duckdb::vector<std::__cxx11::string,true>>
            (&names,deserializer,0xcf,"names");
  Deserializer::ReadProperty<duckdb::vector<duckdb::LogicalType,true>>
            (&expected_types,deserializer,0xd0,"expected_types");
  Deserializer::
  ReadProperty<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)(local_488 + 0x10),(field_id_t)deserializer,(char *)0xd1);
  local_490._M_head_impl = (CopyInfo *)local_488._16_8_;
  local_488._16_8_ = (element_type *)0x0;
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  Deserializer::ReadProperty<std::__cxx11::string>(&name,deserializer,0xd2,"function_name");
  ::std::__cxx11::string::string((string *)&function,"system",(allocator *)&default_extension);
  ::std::__cxx11::string::string((string *)&function_bind_input,"main",(allocator *)&file_extension)
  ;
  pCVar13 = Catalog::GetEntry<duckdb::CopyFunctionCatalogEntry>
                      (context,(string *)&function,(string *)&function_bind_input,&name,
                       (QueryErrorContext)0xffffffffffffffff);
  ::std::__cxx11::string::~string((string *)&function_bind_input);
  ::std::__cxx11::string::~string((string *)&function);
  if ((pCVar13->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.type !=
      COPY_FUNCTION_ENTRY) {
    pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&function,"DeserializeFunction - cant find catalog entry for function %s",
               (allocator *)&function_bind_input);
    ::std::__cxx11::string::string((string *)&local_330,(string *)&name);
    InternalException::InternalException<std::__cxx11::string>
              (pIVar15,(string *)&function,&local_330);
    __cxa_throw(pIVar15,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  CopyFunction::CopyFunction(&function,&pCVar13->function);
  local_4c0._M_head_impl = (FunctionData *)0x0;
  bVar8 = Deserializer::ReadProperty<bool>(deserializer,0xd3,"function_has_serialize");
  if (bVar8) {
    (*deserializer->_vptr_Deserializer[2])(deserializer,0xd4,"function_data");
    (*deserializer->_vptr_Deserializer[6])(deserializer);
    (*function.deserialize)((Deserializer *)&function_bind_input,(CopyFunction *)deserializer);
    pCVar2 = function_bind_input.info;
    _Var1._M_head_impl = local_4c0._M_head_impl;
    function_bind_input.info = (CopyInfo *)0x0;
    local_4c0._M_head_impl = (FunctionData *)pCVar2;
    if ((element_type *)_Var1._M_head_impl != (element_type *)0x0) {
      (*((ParseInfo *)&(_Var1._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
      if (function_bind_input.info != (CopyInfo *)0x0) {
        (*((function_bind_input.info)->super_ParseInfo)._vptr_ParseInfo[1])();
      }
    }
    (*deserializer->_vptr_Deserializer[7])(deserializer);
    (*deserializer->_vptr_Deserializer[3])(deserializer);
  }
  ::std::__cxx11::string::string((string *)&default_extension,(string *)&function.extension);
  local_3d0._0_8_ = local_3d0 + 0x10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)default_extension._M_dataplus._M_p == &default_extension.field_2) {
    local_3d0._24_8_ = default_extension.field_2._8_8_;
  }
  else {
    local_3d0._0_8_ = default_extension._M_dataplus._M_p;
  }
  local_3d0._8_8_ = default_extension._M_string_length;
  default_extension._M_string_length = 0;
  default_extension.field_2._M_local_buf[0] = '\0';
  local_488._8_8_ = &file_extension;
  default_extension._M_dataplus._M_p = (pointer)&default_extension.field_2;
  Deserializer::ReadPropertyWithExplicitDefault<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_488._8_8_,
             deserializer,0xd5,"file_extension",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d0);
  ::std::__cxx11::string::~string((string *)local_3d0);
  bVar9 = Deserializer::ReadPropertyWithExplicitDefault<bool>(deserializer,0xd6,"rotate",false);
  CVar10 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::CopyFunctionReturnType>
                     (deserializer,0xd7,"return_type",CHANGED_ROWS);
  write_part_cols =
       Deserializer::ReadPropertyWithExplicitDefault<bool>
                 (deserializer,0xd8,"write_partition_columns",true);
  bVar11 = Deserializer::ReadPropertyWithExplicitDefault<bool>
                     (deserializer,0xd9,"write_empty_file",true);
  PVar12 = Deserializer::ReadPropertyWithExplicitDefault<duckdb::PreserveOrderType>
                     (deserializer,0xda,"preserve_order",AUTOMATIC);
  if (!bVar8) {
    if (function.copy_to_bind == (copy_to_bind_t)0x0) {
      pIVar15 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&function_bind_input,
                 "Copy function \"%s\" has neither bind nor (de)serialize",
                 (allocator *)&names_to_write);
      ::std::__cxx11::string::string((string *)&local_350,(string *)&function.super_Function.name);
      InternalException::InternalException<std::__cxx11::string>
                (pIVar15,(string *)&function_bind_input,&local_350);
      __cxa_throw(pIVar15,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    function_bind_input.info =
         unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator*
                   ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                    &local_490);
    function_bind_input.file_extension._M_dataplus._M_p =
         (pointer)&function_bind_input.file_extension.field_2;
    function_bind_input.file_extension._M_string_length = 0;
    function_bind_input.file_extension.field_2._M_local_buf[0] = '\0';
    GetNamesWithoutPartitions(&names_to_write,&names,&partition_columns,write_part_cols);
    GetTypesWithoutPartitions(&types_to_write,&expected_types,&partition_columns,write_part_cols);
    (*function.copy_to_bind)
              ((ClientContext *)local_488,(CopyFunctionBindInput *)context,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                *)&function_bind_input,(vector<duckdb::LogicalType,_true> *)&names_to_write);
    uVar3 = local_488._0_8_;
    _Var1._M_head_impl = local_4c0._M_head_impl;
    local_488._0_8_ = (element_type *)0x0;
    local_4c0._M_head_impl = (FunctionData *)uVar3;
    if ((element_type *)_Var1._M_head_impl != (element_type *)0x0) {
      (*((ParseInfo *)&(_Var1._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
      if ((element_type *)local_488._0_8_ != (element_type *)0x0) {
        (*((ParseInfo *)local_488._0_8_)->_vptr_ParseInfo[1])();
      }
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              (&types_to_write.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&names_to_write);
    ::std::__cxx11::string::~string((string *)&function_bind_input.file_extension);
  }
  make_uniq<duckdb::LogicalCopyToFile,duckdb::CopyFunction&,duckdb::unique_ptr<duckdb::FunctionData,std::default_delete<duckdb::FunctionData>,true>,duckdb::unique_ptr<duckdb::CopyInfo,std::default_delete<duckdb::CopyInfo>,true>>
            ((duckdb *)&function_bind_input,&function,
             (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> *)
             &local_4c0,
             (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)&local_490
            );
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  ::std::__cxx11::string::_M_assign((string *)&pLVar14->file_path);
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->use_tmp_file = bVar4;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  FilenamePattern::operator=(&pLVar14->filename_pattern,&filename_pattern);
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  ::std::__cxx11::string::_M_assign((string *)&pLVar14->file_extension);
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->overwrite_mode = CVar5;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->per_thread_output = bVar6;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->partition_output = bVar7;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&(pLVar14->partition_columns).
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>,
             &partition_columns.super_vector<unsigned_long,_std::allocator<unsigned_long>_>);
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pLVar14->names,
              &names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pLVar14->expected_types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &expected_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
            );
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->rotate = bVar9;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->return_type = CVar10;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->write_partition_columns = write_part_cols;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->write_empty_file = bVar11;
  pLVar14 = unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
            ::operator->((unique_ptr<duckdb::LogicalCopyToFile,_std::default_delete<duckdb::LogicalCopyToFile>,_true>
                          *)&function_bind_input);
  pLVar14->preserve_order = PVar12;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)function_bind_input.info;
  ::std::__cxx11::string::~string((string *)&file_extension);
  ::std::__cxx11::string::~string((string *)&default_extension);
  if ((element_type *)local_4c0._M_head_impl != (element_type *)0x0) {
    (*((ParseInfo *)&(local_4c0._M_head_impl)->_vptr_FunctionData)->_vptr_ParseInfo[1])();
  }
  CopyFunction::~CopyFunction(&function);
  ::std::__cxx11::string::~string((string *)&name);
  if (local_490._M_head_impl != (CopyInfo *)0x0) {
    (*(code *)(((ClientContext *)((local_490._M_head_impl)->super_ParseInfo)._vptr_ParseInfo)->
              super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&expected_types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
            );
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&names);
  ::std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&partition_columns);
  ::std::__cxx11::string::~string((string *)&filename_pattern);
  ::std::__cxx11::string::~string((string *)&file_path);
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalCopyToFile::Deserialize(Deserializer &deserializer) {
	auto file_path = deserializer.ReadProperty<string>(200, "file_path");
	auto use_tmp_file = deserializer.ReadProperty<bool>(201, "use_tmp_file");
	auto filename_pattern = deserializer.ReadProperty<FilenamePattern>(202, "filename_pattern");
	auto overwrite_mode = deserializer.ReadProperty<CopyOverwriteMode>(203, "overwrite_mode");
	auto per_thread_output = deserializer.ReadProperty<bool>(204, "per_thread_output");
	auto partition_output = deserializer.ReadProperty<bool>(205, "partition_output");
	auto partition_columns = deserializer.ReadProperty<vector<idx_t>>(206, "partition_columns");
	auto names = deserializer.ReadProperty<vector<string>>(207, "names");
	auto expected_types = deserializer.ReadProperty<vector<LogicalType>>(208, "expected_types");
	auto copy_info =
	    unique_ptr_cast<ParseInfo, CopyInfo>(deserializer.ReadProperty<unique_ptr<ParseInfo>>(209, "copy_info"));

	// Deserialize function
	auto &context = deserializer.Get<ClientContext &>();
	auto name = deserializer.ReadProperty<string>(210, "function_name");

	auto &func_catalog_entry =
	    Catalog::GetEntry<CopyFunctionCatalogEntry>(context, SYSTEM_CATALOG, DEFAULT_SCHEMA, name);
	if (func_catalog_entry.type != CatalogType::COPY_FUNCTION_ENTRY) {
		throw InternalException("DeserializeFunction - cant find catalog entry for function %s", name);
	}
	auto &function_entry = func_catalog_entry.Cast<CopyFunctionCatalogEntry>();
	auto function = function_entry.function;
	// Deserialize function data
	unique_ptr<FunctionData> bind_data;
	auto has_serialize = deserializer.ReadProperty<bool>(211, "function_has_serialize");
	if (has_serialize) {
		// Just deserialize the bind data
		deserializer.ReadObject(212, "function_data",
		                        [&](Deserializer &obj) { bind_data = function.deserialize(obj, function); });
	}

	auto default_extension = function.extension;

	auto file_extension =
	    deserializer.ReadPropertyWithExplicitDefault<string>(213, "file_extension", std::move(default_extension));

	auto rotate = deserializer.ReadPropertyWithExplicitDefault(214, "rotate", false);
	auto return_type =
	    deserializer.ReadPropertyWithExplicitDefault(215, "return_type", CopyFunctionReturnType::CHANGED_ROWS);
	auto write_partition_columns = deserializer.ReadPropertyWithExplicitDefault(216, "write_partition_columns", true);
	auto write_empty_file = deserializer.ReadPropertyWithExplicitDefault(217, "write_empty_file", true);
	auto preserve_order =
	    deserializer.ReadPropertyWithExplicitDefault(218, "preserve_order", PreserveOrderType::AUTOMATIC);

	if (!has_serialize) {
		// If not serialized, re-bind with the copy info
		if (!function.copy_to_bind) {
			throw InternalException("Copy function \"%s\" has neither bind nor (de)serialize", function.name);
		}

		CopyFunctionBindInput function_bind_input(*copy_info);
		auto names_to_write = GetNamesWithoutPartitions(names, partition_columns, write_partition_columns);
		auto types_to_write = GetTypesWithoutPartitions(expected_types, partition_columns, write_partition_columns);
		bind_data = function.copy_to_bind(context, function_bind_input, names_to_write, types_to_write);
	}

	auto result = make_uniq<LogicalCopyToFile>(function, std::move(bind_data), std::move(copy_info));
	result->file_path = file_path;
	result->use_tmp_file = use_tmp_file;
	result->filename_pattern = filename_pattern;
	result->file_extension = file_extension;
	result->overwrite_mode = overwrite_mode;
	result->per_thread_output = per_thread_output;
	result->partition_output = partition_output;
	result->partition_columns = partition_columns;
	result->names = names;
	result->expected_types = expected_types;
	result->rotate = rotate;
	result->return_type = return_type;
	result->write_partition_columns = write_partition_columns;
	result->write_empty_file = write_empty_file;
	result->preserve_order = preserve_order;

	return std::move(result);
}